

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_impl.c
# Opt level: O0

void mzd_share(lowmc_parameters_t *lowmc,mzd_local_t *r,mzd_local_t *v1,mzd_local_t *v2,
              mzd_local_t *v3)

{
  mzd_local_t *in_RCX;
  mzd_local_t *in_RDX;
  mzd_local_t *in_RSI;
  ushort *in_RDI;
  mzd_local_t *in_R8;
  
  if (((DAT_0022510c & 0x400) == 0x400) && ((DAT_0022510c & 0x20000) == 0x20000)) {
    if (*in_RDI < 0x81) {
      mzd_share_s256_128(in_RSI,in_RDX,in_RCX,in_R8);
    }
    else {
      mzd_share_s256_256(in_RDX,in_RCX,in_R8,(mzd_local_t *)0x13d349);
    }
  }
  else if (*in_RDI < 0x81) {
    mzd_share_s128_128(in_RSI,in_RDX,in_RCX,in_R8);
  }
  else {
    mzd_share_s128_256(in_RSI,in_RDX,in_RCX,in_R8);
  }
  return;
}

Assistant:

static void mzd_share(const lowmc_parameters_t* lowmc, mzd_local_t* r, const mzd_local_t* v1,
                      const mzd_local_t* v2, const mzd_local_t* v3) {
#if defined(WITH_OPT)
#if defined(WITH_AVX2)
  if (CPU_SUPPORTS_AVX2) {
    if (lowmc->n > 128) {
      mzd_share_s256_256(r, v1, v2, v3);
    } else {
      mzd_share_s256_128(r, v1, v2, v3);
    }
    return;
  }
#endif
#if defined(WITH_SSE2) || defined(WITH_NEON)
  if (CPU_SUPPORTS_SSE2 || CPU_SUPPORTS_NEON) {
    if (lowmc->n > 128) {
      mzd_share_s128_256(r, v1, v2, v3);
    } else {
      mzd_share_s128_128(r, v1, v2, v3);
    }
    return;
  }
#endif
#endif

#if !defined(NO_UINT64_FALLBACK)
  if (lowmc->n <= 128) {
    mzd_share_uint64_128(r, v1, v2, v3);
  } else if (lowmc->n <= 192) {
    mzd_share_uint64_192(r, v1, v2, v3);
  } else {
    mzd_share_uint64_256(r, v1, v2, v3);
  }
#endif
}